

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseMatrix.cpp
# Opt level: O3

void __thiscall
HighsSparseMatrix::priceByColumn
          (HighsSparseMatrix *this,bool quad_precision,HVector *result,HVector *column,
          HighsInt debug_report)

{
  int iVar1;
  int iVar2;
  pointer piVar3;
  pointer piVar4;
  pointer pdVar5;
  pointer pdVar6;
  pointer piVar7;
  pointer pdVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  
  if (-2 < debug_report) {
    puts("\nHighsSparseMatrix::priceByColumn:");
  }
  result->count = 0;
  iVar9 = this->num_col_;
  if (0 < iVar9) {
    piVar3 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar4 = (this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = (column->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar6 = (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar7 = (result->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar8 = (result->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar10 = 0;
    do {
      iVar1 = piVar3[lVar10];
      lVar11 = (long)iVar1;
      iVar2 = piVar3[lVar10 + 1];
      dVar12 = 0.0;
      if (quad_precision) {
        if (iVar1 < iVar2) {
          dVar13 = 0.0;
          do {
            dVar15 = pdVar5[piVar4[lVar11]] * pdVar6[lVar11];
            dVar14 = dVar13 + dVar15;
            dVar12 = dVar12 + (dVar13 - (dVar14 - dVar15)) + (dVar15 - (dVar14 - (dVar14 - dVar15)))
            ;
            lVar11 = lVar11 + 1;
            dVar13 = dVar14;
          } while (iVar2 != lVar11);
          dVar12 = dVar12 + dVar14;
        }
      }
      else if (iVar1 < iVar2) {
        do {
          dVar12 = dVar12 + pdVar5[piVar4[lVar11]] * pdVar6[lVar11];
          lVar11 = lVar11 + 1;
        } while (iVar2 != lVar11);
      }
      if (1e-14 < ABS(dVar12)) {
        pdVar8[lVar10] = dVar12;
        iVar9 = result->count;
        result->count = iVar9 + 1;
        piVar7[iVar9] = (int)lVar10;
        iVar9 = this->num_col_;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < iVar9);
  }
  return;
}

Assistant:

void HighsSparseMatrix::priceByColumn(const bool quad_precision,
                                      HVector& result, const HVector& column,
                                      const HighsInt debug_report) const {
  assert(this->isColwise());
  if (debug_report >= kDebugReportAll)
    printf("\nHighsSparseMatrix::priceByColumn:\n");
  result.count = 0;
  for (HighsInt iCol = 0; iCol < this->num_col_; iCol++) {
    double value = 0;
    if (quad_precision) {
      HighsCDouble quad_value = 0.0;
      for (HighsInt iEl = this->start_[iCol]; iEl < this->start_[iCol + 1];
           iEl++)
        quad_value += column.array[this->index_[iEl]] * this->value_[iEl];
      value = (double)quad_value;
    } else {
      for (HighsInt iEl = this->start_[iCol]; iEl < this->start_[iCol + 1];
           iEl++)
        value += column.array[this->index_[iEl]] * this->value_[iEl];
    }
    if (fabs(value) > kHighsTiny) {
      result.array[iCol] = value;
      result.index[result.count++] = iCol;
    }
  }
}